

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetB.c
# Opt level: O0

void fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(uint8_t *out1,uint64_t *arg1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 *in_RSI;
  undefined1 *in_RDI;
  uint8_t x101;
  uint64_t x100;
  uint8_t x99;
  uint64_t x98;
  uint8_t x97;
  uint64_t x96;
  uint8_t x95;
  uint64_t x94;
  uint8_t x93;
  uint8_t x92;
  uint8_t x91;
  uint64_t x90;
  uint8_t x89;
  uint64_t x88;
  uint8_t x87;
  uint64_t x86;
  uint8_t x85;
  uint64_t x84;
  uint8_t x83;
  uint64_t x82;
  uint8_t x81;
  uint64_t x80;
  uint8_t x79;
  uint8_t x78;
  uint8_t x77;
  uint64_t x76;
  uint8_t x75;
  uint64_t x74;
  uint8_t x73;
  uint64_t x72;
  uint8_t x71;
  uint64_t x70;
  uint8_t x69;
  uint64_t x68;
  uint8_t x67;
  uint64_t x66;
  uint8_t x65;
  uint8_t x64;
  uint8_t x63;
  uint64_t x62;
  uint8_t x61;
  uint64_t x60;
  uint8_t x59;
  uint64_t x58;
  uint8_t x57;
  uint64_t x56;
  uint8_t x55;
  uint64_t x54;
  uint8_t x53;
  uint64_t x52;
  uint8_t x51;
  uint8_t x50;
  uint8_t x49;
  uint64_t x48;
  uint8_t x47;
  uint64_t x46;
  uint8_t x45;
  uint64_t x44;
  uint8_t x43;
  uint64_t x42;
  uint8_t x41;
  uint64_t x40;
  uint8_t x39;
  uint64_t x38;
  uint8_t x37;
  uint8_t x36;
  uint8_t x35;
  uint64_t x34;
  uint8_t x33;
  uint64_t x32;
  uint8_t x31;
  uint64_t x30;
  uint8_t x29;
  uint64_t x28;
  uint8_t x27;
  uint64_t x26;
  uint8_t x25;
  uint64_t x24;
  uint8_t x23;
  uint8_t x22;
  uint8_t x21;
  uint64_t x20;
  uint8_t x19;
  uint64_t x18;
  uint8_t x17;
  uint64_t x16;
  uint8_t x15;
  uint64_t x14;
  uint8_t x13;
  uint64_t x12;
  uint8_t x11;
  uint64_t x10;
  uint8_t x9;
  uint64_t x8;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint8_t x120;
  uint8_t x119;
  uint64_t x118;
  uint8_t x117;
  uint64_t x116;
  uint8_t x115;
  uint64_t x114;
  uint8_t x113;
  uint64_t x112;
  uint8_t x111;
  uint64_t x110;
  uint8_t x109;
  uint64_t x108;
  uint8_t x107;
  uint8_t x106;
  uint8_t x105;
  uint64_t x104;
  uint8_t x103;
  uint64_t x102;
  
  uVar1 = in_RSI[7];
  uVar2 = in_RSI[6];
  uVar3 = in_RSI[5];
  uVar4 = in_RSI[4];
  uVar5 = in_RSI[3];
  uVar6 = in_RSI[2];
  uVar7 = in_RSI[1];
  uVar8 = *in_RSI;
  *in_RDI = (char)uVar8;
  in_RDI[1] = (char)((ulong)uVar8 >> 8);
  in_RDI[2] = (char)((ulong)uVar8 >> 0x10);
  in_RDI[3] = (char)((ulong)uVar8 >> 0x18);
  in_RDI[4] = (char)((ulong)uVar8 >> 0x20);
  in_RDI[5] = (char)((ulong)uVar8 >> 0x28);
  in_RDI[6] = (char)((ulong)uVar8 >> 0x30);
  in_RDI[7] = (char)((ulong)uVar8 >> 0x38);
  in_RDI[8] = (char)uVar7;
  in_RDI[9] = (char)((ulong)uVar7 >> 8);
  in_RDI[10] = (char)((ulong)uVar7 >> 0x10);
  in_RDI[0xb] = (char)((ulong)uVar7 >> 0x18);
  in_RDI[0xc] = (char)((ulong)uVar7 >> 0x20);
  in_RDI[0xd] = (char)((ulong)uVar7 >> 0x28);
  in_RDI[0xe] = (char)((ulong)uVar7 >> 0x30);
  in_RDI[0xf] = (char)((ulong)uVar7 >> 0x38);
  in_RDI[0x10] = (char)uVar6;
  in_RDI[0x11] = (char)((ulong)uVar6 >> 8);
  in_RDI[0x12] = (char)((ulong)uVar6 >> 0x10);
  in_RDI[0x13] = (char)((ulong)uVar6 >> 0x18);
  in_RDI[0x14] = (char)((ulong)uVar6 >> 0x20);
  in_RDI[0x15] = (char)((ulong)uVar6 >> 0x28);
  in_RDI[0x16] = (char)((ulong)uVar6 >> 0x30);
  in_RDI[0x17] = (char)((ulong)uVar6 >> 0x38);
  in_RDI[0x18] = (char)uVar5;
  in_RDI[0x19] = (char)((ulong)uVar5 >> 8);
  in_RDI[0x1a] = (char)((ulong)uVar5 >> 0x10);
  in_RDI[0x1b] = (char)((ulong)uVar5 >> 0x18);
  in_RDI[0x1c] = (char)((ulong)uVar5 >> 0x20);
  in_RDI[0x1d] = (char)((ulong)uVar5 >> 0x28);
  in_RDI[0x1e] = (char)((ulong)uVar5 >> 0x30);
  in_RDI[0x1f] = (char)((ulong)uVar5 >> 0x38);
  in_RDI[0x20] = (char)uVar4;
  in_RDI[0x21] = (char)((ulong)uVar4 >> 8);
  in_RDI[0x22] = (char)((ulong)uVar4 >> 0x10);
  in_RDI[0x23] = (char)((ulong)uVar4 >> 0x18);
  in_RDI[0x24] = (char)((ulong)uVar4 >> 0x20);
  in_RDI[0x25] = (char)((ulong)uVar4 >> 0x28);
  in_RDI[0x26] = (char)((ulong)uVar4 >> 0x30);
  in_RDI[0x27] = (char)((ulong)uVar4 >> 0x38);
  in_RDI[0x28] = (char)uVar3;
  in_RDI[0x29] = (char)((ulong)uVar3 >> 8);
  in_RDI[0x2a] = (char)((ulong)uVar3 >> 0x10);
  in_RDI[0x2b] = (char)((ulong)uVar3 >> 0x18);
  in_RDI[0x2c] = (char)((ulong)uVar3 >> 0x20);
  in_RDI[0x2d] = (char)((ulong)uVar3 >> 0x28);
  in_RDI[0x2e] = (char)((ulong)uVar3 >> 0x30);
  in_RDI[0x2f] = (char)((ulong)uVar3 >> 0x38);
  in_RDI[0x30] = (char)uVar2;
  in_RDI[0x31] = (char)((ulong)uVar2 >> 8);
  in_RDI[0x32] = (char)((ulong)uVar2 >> 0x10);
  in_RDI[0x33] = (char)((ulong)uVar2 >> 0x18);
  in_RDI[0x34] = (char)((ulong)uVar2 >> 0x20);
  in_RDI[0x35] = (char)((ulong)uVar2 >> 0x28);
  in_RDI[0x36] = (char)((ulong)uVar2 >> 0x30);
  in_RDI[0x37] = (char)((ulong)uVar2 >> 0x38);
  in_RDI[0x38] = (char)uVar1;
  in_RDI[0x39] = (char)((ulong)uVar1 >> 8);
  in_RDI[0x3a] = (char)((ulong)uVar1 >> 0x10);
  in_RDI[0x3b] = (char)((ulong)uVar1 >> 0x18);
  in_RDI[0x3c] = (char)((ulong)uVar1 >> 0x20);
  in_RDI[0x3d] = (char)((ulong)uVar1 >> 0x28);
  in_RDI[0x3e] = (char)((ulong)uVar1 >> 0x30);
  in_RDI[0x3f] = (char)((ulong)uVar1 >> 0x38);
  return;
}

Assistant:

static void fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(
    uint8_t out1[64], const uint64_t arg1[8]) {
    uint64_t x1;
    uint64_t x2;
    uint64_t x3;
    uint64_t x4;
    uint64_t x5;
    uint64_t x6;
    uint64_t x7;
    uint64_t x8;
    uint8_t x9;
    uint64_t x10;
    uint8_t x11;
    uint64_t x12;
    uint8_t x13;
    uint64_t x14;
    uint8_t x15;
    uint64_t x16;
    uint8_t x17;
    uint64_t x18;
    uint8_t x19;
    uint64_t x20;
    uint8_t x21;
    uint8_t x22;
    uint8_t x23;
    uint64_t x24;
    uint8_t x25;
    uint64_t x26;
    uint8_t x27;
    uint64_t x28;
    uint8_t x29;
    uint64_t x30;
    uint8_t x31;
    uint64_t x32;
    uint8_t x33;
    uint64_t x34;
    uint8_t x35;
    uint8_t x36;
    uint8_t x37;
    uint64_t x38;
    uint8_t x39;
    uint64_t x40;
    uint8_t x41;
    uint64_t x42;
    uint8_t x43;
    uint64_t x44;
    uint8_t x45;
    uint64_t x46;
    uint8_t x47;
    uint64_t x48;
    uint8_t x49;
    uint8_t x50;
    uint8_t x51;
    uint64_t x52;
    uint8_t x53;
    uint64_t x54;
    uint8_t x55;
    uint64_t x56;
    uint8_t x57;
    uint64_t x58;
    uint8_t x59;
    uint64_t x60;
    uint8_t x61;
    uint64_t x62;
    uint8_t x63;
    uint8_t x64;
    uint8_t x65;
    uint64_t x66;
    uint8_t x67;
    uint64_t x68;
    uint8_t x69;
    uint64_t x70;
    uint8_t x71;
    uint64_t x72;
    uint8_t x73;
    uint64_t x74;
    uint8_t x75;
    uint64_t x76;
    uint8_t x77;
    uint8_t x78;
    uint8_t x79;
    uint64_t x80;
    uint8_t x81;
    uint64_t x82;
    uint8_t x83;
    uint64_t x84;
    uint8_t x85;
    uint64_t x86;
    uint8_t x87;
    uint64_t x88;
    uint8_t x89;
    uint64_t x90;
    uint8_t x91;
    uint8_t x92;
    uint8_t x93;
    uint64_t x94;
    uint8_t x95;
    uint64_t x96;
    uint8_t x97;
    uint64_t x98;
    uint8_t x99;
    uint64_t x100;
    uint8_t x101;
    uint64_t x102;
    uint8_t x103;
    uint64_t x104;
    uint8_t x105;
    uint8_t x106;
    uint8_t x107;
    uint64_t x108;
    uint8_t x109;
    uint64_t x110;
    uint8_t x111;
    uint64_t x112;
    uint8_t x113;
    uint64_t x114;
    uint8_t x115;
    uint64_t x116;
    uint8_t x117;
    uint64_t x118;
    uint8_t x119;
    uint8_t x120;
    x1 = (arg1[7]);
    x2 = (arg1[6]);
    x3 = (arg1[5]);
    x4 = (arg1[4]);
    x5 = (arg1[3]);
    x6 = (arg1[2]);
    x7 = (arg1[1]);
    x8 = (arg1[0]);
    x9 = (uint8_t)(x8 & UINT8_C(0xff));
    x10 = (x8 >> 8);
    x11 = (uint8_t)(x10 & UINT8_C(0xff));
    x12 = (x10 >> 8);
    x13 = (uint8_t)(x12 & UINT8_C(0xff));
    x14 = (x12 >> 8);
    x15 = (uint8_t)(x14 & UINT8_C(0xff));
    x16 = (x14 >> 8);
    x17 = (uint8_t)(x16 & UINT8_C(0xff));
    x18 = (x16 >> 8);
    x19 = (uint8_t)(x18 & UINT8_C(0xff));
    x20 = (x18 >> 8);
    x21 = (uint8_t)(x20 & UINT8_C(0xff));
    x22 = (uint8_t)(x20 >> 8);
    x23 = (uint8_t)(x7 & UINT8_C(0xff));
    x24 = (x7 >> 8);
    x25 = (uint8_t)(x24 & UINT8_C(0xff));
    x26 = (x24 >> 8);
    x27 = (uint8_t)(x26 & UINT8_C(0xff));
    x28 = (x26 >> 8);
    x29 = (uint8_t)(x28 & UINT8_C(0xff));
    x30 = (x28 >> 8);
    x31 = (uint8_t)(x30 & UINT8_C(0xff));
    x32 = (x30 >> 8);
    x33 = (uint8_t)(x32 & UINT8_C(0xff));
    x34 = (x32 >> 8);
    x35 = (uint8_t)(x34 & UINT8_C(0xff));
    x36 = (uint8_t)(x34 >> 8);
    x37 = (uint8_t)(x6 & UINT8_C(0xff));
    x38 = (x6 >> 8);
    x39 = (uint8_t)(x38 & UINT8_C(0xff));
    x40 = (x38 >> 8);
    x41 = (uint8_t)(x40 & UINT8_C(0xff));
    x42 = (x40 >> 8);
    x43 = (uint8_t)(x42 & UINT8_C(0xff));
    x44 = (x42 >> 8);
    x45 = (uint8_t)(x44 & UINT8_C(0xff));
    x46 = (x44 >> 8);
    x47 = (uint8_t)(x46 & UINT8_C(0xff));
    x48 = (x46 >> 8);
    x49 = (uint8_t)(x48 & UINT8_C(0xff));
    x50 = (uint8_t)(x48 >> 8);
    x51 = (uint8_t)(x5 & UINT8_C(0xff));
    x52 = (x5 >> 8);
    x53 = (uint8_t)(x52 & UINT8_C(0xff));
    x54 = (x52 >> 8);
    x55 = (uint8_t)(x54 & UINT8_C(0xff));
    x56 = (x54 >> 8);
    x57 = (uint8_t)(x56 & UINT8_C(0xff));
    x58 = (x56 >> 8);
    x59 = (uint8_t)(x58 & UINT8_C(0xff));
    x60 = (x58 >> 8);
    x61 = (uint8_t)(x60 & UINT8_C(0xff));
    x62 = (x60 >> 8);
    x63 = (uint8_t)(x62 & UINT8_C(0xff));
    x64 = (uint8_t)(x62 >> 8);
    x65 = (uint8_t)(x4 & UINT8_C(0xff));
    x66 = (x4 >> 8);
    x67 = (uint8_t)(x66 & UINT8_C(0xff));
    x68 = (x66 >> 8);
    x69 = (uint8_t)(x68 & UINT8_C(0xff));
    x70 = (x68 >> 8);
    x71 = (uint8_t)(x70 & UINT8_C(0xff));
    x72 = (x70 >> 8);
    x73 = (uint8_t)(x72 & UINT8_C(0xff));
    x74 = (x72 >> 8);
    x75 = (uint8_t)(x74 & UINT8_C(0xff));
    x76 = (x74 >> 8);
    x77 = (uint8_t)(x76 & UINT8_C(0xff));
    x78 = (uint8_t)(x76 >> 8);
    x79 = (uint8_t)(x3 & UINT8_C(0xff));
    x80 = (x3 >> 8);
    x81 = (uint8_t)(x80 & UINT8_C(0xff));
    x82 = (x80 >> 8);
    x83 = (uint8_t)(x82 & UINT8_C(0xff));
    x84 = (x82 >> 8);
    x85 = (uint8_t)(x84 & UINT8_C(0xff));
    x86 = (x84 >> 8);
    x87 = (uint8_t)(x86 & UINT8_C(0xff));
    x88 = (x86 >> 8);
    x89 = (uint8_t)(x88 & UINT8_C(0xff));
    x90 = (x88 >> 8);
    x91 = (uint8_t)(x90 & UINT8_C(0xff));
    x92 = (uint8_t)(x90 >> 8);
    x93 = (uint8_t)(x2 & UINT8_C(0xff));
    x94 = (x2 >> 8);
    x95 = (uint8_t)(x94 & UINT8_C(0xff));
    x96 = (x94 >> 8);
    x97 = (uint8_t)(x96 & UINT8_C(0xff));
    x98 = (x96 >> 8);
    x99 = (uint8_t)(x98 & UINT8_C(0xff));
    x100 = (x98 >> 8);
    x101 = (uint8_t)(x100 & UINT8_C(0xff));
    x102 = (x100 >> 8);
    x103 = (uint8_t)(x102 & UINT8_C(0xff));
    x104 = (x102 >> 8);
    x105 = (uint8_t)(x104 & UINT8_C(0xff));
    x106 = (uint8_t)(x104 >> 8);
    x107 = (uint8_t)(x1 & UINT8_C(0xff));
    x108 = (x1 >> 8);
    x109 = (uint8_t)(x108 & UINT8_C(0xff));
    x110 = (x108 >> 8);
    x111 = (uint8_t)(x110 & UINT8_C(0xff));
    x112 = (x110 >> 8);
    x113 = (uint8_t)(x112 & UINT8_C(0xff));
    x114 = (x112 >> 8);
    x115 = (uint8_t)(x114 & UINT8_C(0xff));
    x116 = (x114 >> 8);
    x117 = (uint8_t)(x116 & UINT8_C(0xff));
    x118 = (x116 >> 8);
    x119 = (uint8_t)(x118 & UINT8_C(0xff));
    x120 = (uint8_t)(x118 >> 8);
    out1[0] = x9;
    out1[1] = x11;
    out1[2] = x13;
    out1[3] = x15;
    out1[4] = x17;
    out1[5] = x19;
    out1[6] = x21;
    out1[7] = x22;
    out1[8] = x23;
    out1[9] = x25;
    out1[10] = x27;
    out1[11] = x29;
    out1[12] = x31;
    out1[13] = x33;
    out1[14] = x35;
    out1[15] = x36;
    out1[16] = x37;
    out1[17] = x39;
    out1[18] = x41;
    out1[19] = x43;
    out1[20] = x45;
    out1[21] = x47;
    out1[22] = x49;
    out1[23] = x50;
    out1[24] = x51;
    out1[25] = x53;
    out1[26] = x55;
    out1[27] = x57;
    out1[28] = x59;
    out1[29] = x61;
    out1[30] = x63;
    out1[31] = x64;
    out1[32] = x65;
    out1[33] = x67;
    out1[34] = x69;
    out1[35] = x71;
    out1[36] = x73;
    out1[37] = x75;
    out1[38] = x77;
    out1[39] = x78;
    out1[40] = x79;
    out1[41] = x81;
    out1[42] = x83;
    out1[43] = x85;
    out1[44] = x87;
    out1[45] = x89;
    out1[46] = x91;
    out1[47] = x92;
    out1[48] = x93;
    out1[49] = x95;
    out1[50] = x97;
    out1[51] = x99;
    out1[52] = x101;
    out1[53] = x103;
    out1[54] = x105;
    out1[55] = x106;
    out1[56] = x107;
    out1[57] = x109;
    out1[58] = x111;
    out1[59] = x113;
    out1[60] = x115;
    out1[61] = x117;
    out1[62] = x119;
    out1[63] = x120;
}